

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O0

void __thiscall zmq::null_mechanism_t::zap_msg_available(null_mechanism_t *this)

{
  null_mechanism_t *in_stack_00000018;
  
  zap_msg_available(in_stack_00000018);
  return;
}

Assistant:

int zmq::null_mechanism_t::zap_msg_available ()
{
    if (_zap_reply_received) {
        errno = EFSM;
        return -1;
    }
    const int rc = receive_and_process_zap_reply ();
    if (rc == 0)
        _zap_reply_received = true;
    return rc == -1 ? -1 : 0;
}